

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool str_is_printable(char *value)

{
  char cVar1;
  uchar *_value;
  char *pcVar2;
  _Bool _Var3;
  
  cVar1 = *value;
  _Var3 = cVar1 == '\0';
  if ((!_Var3) && ((byte)(cVar1 - 0x20U) < 0xdf && cVar1 != '\x7f')) {
    pcVar2 = value + 1;
    do {
      cVar1 = *pcVar2;
      _Var3 = cVar1 == '\0';
      if (_Var3) {
        return _Var3;
      }
      if (cVar1 == '\x7f') {
        return _Var3;
      }
      pcVar2 = pcVar2 + 1;
    } while ((byte)(cVar1 - 0x20U) < 0xdf);
  }
  return _Var3;
}

Assistant:

bool
str_is_printable(const char *value) {
  const unsigned char *_value;

  _value = (const unsigned char *)value;

  while (*_value) {
    if (!str_char_is_printable(*_value)) {
      return false;
    }
    _value++;
  }
  return true;
}